

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Output.cpp
# Opt level: O2

void __thiscall
Test::Assertion::Assertion
          (Assertion *this,char *fileName,uint32_t lineNum,string *errorMsg,string *userMsg)

{
  allocator<char> local_44;
  allocator<char> local_43;
  allocator<char> local_42;
  allocator<char> local_41;
  string *local_40;
  string *local_38;
  
  std::__cxx11::string::string((string *)this,"",&local_41);
  std::__cxx11::string::string((string *)&this->file,fileName,&local_42);
  local_40 = &this->method;
  local_38 = &this->file;
  std::__cxx11::string::string((string *)local_40,"",&local_43);
  std::__cxx11::string::string((string *)&this->args,"",&local_44);
  std::__cxx11::string::string((string *)&this->errorMessage,errorMsg);
  std::__cxx11::string::string((string *)&this->userMessage,userMsg);
  this->lineNumber = lineNum;
  return;
}

Assistant:

Assertion::Assertion(
    const char *fileName, uint32_t lineNum, const std::string &errorMsg, const std::string &userMsg)
    : suite(""), file(fileName), method(""), args(""), errorMessage(errorMsg), userMessage(userMsg),
      lineNumber(lineNum) {}